

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O2

void __thiscall Qentem::StringStream<char>::allocate(StringStream<char> *this,SizeT size)

{
  uint uVar1;
  char *pointer;
  uint uVar2;
  
  uVar1 = (uint)(byte)((byte)LZCOUNT(size) ^ 0x1f);
  uVar2 = 1 << (uVar1 & 0x1f);
  uVar1 = 2 << (uVar1 & 0x1f);
  if (size <= uVar2) {
    uVar1 = uVar2;
  }
  pointer = (char *)operator_new((ulong)uVar1);
  MemoryRecord::AddAllocation(pointer);
  this->storage_ = pointer;
  this->capacity_ = uVar1;
  return;
}

Assistant:

void allocate(SizeT size) {
        size = Memory::AlignSize(size);

        setStorage(Memory::Allocate<Char_T>(size));

        setCapacity(size);
    }